

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall
wabt::WastParser::ParseSimdV128Const
          (WastParser *this,Const *const_,TokenType token_type,ConstType const_type)

{
  size_t sVar1;
  Result RVar2;
  ulong uVar3;
  Literal *pLVar4;
  char *pcVar5;
  int lane;
  ulong uVar6;
  ulong uStackY_180;
  allocator<char> local_14d;
  undefined4 local_14c;
  ConstType local_148;
  uint local_144;
  ulong local_140;
  uint64_t value;
  char *pcStack_130;
  anon_union_16_2_ecfd7102_for_Location_1 local_128;
  undefined1 local_118 [32];
  ExpectedNan local_f8;
  size_t local_e8;
  char *pcStack_e0;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_d8;
  undefined8 uStack_d0;
  size_t local_c8;
  char *pcStack_c0;
  size_t local_b8;
  undefined8 uStack_b0;
  Location loc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  Token token;
  
  local_14c = (undefined4)CONCAT71((uint7)(uint3)(const_type >> 8),1);
  local_148 = const_type;
  switch(token_type) {
  case I8X16:
    uStackY_180 = 0x10;
    break;
  case I16X8:
    uStackY_180 = 8;
    break;
  case I32X4:
    uStackY_180 = 4;
    break;
  case I64X2:
    uStackY_180 = 2;
    break;
  case F32X4:
    uStackY_180 = 4;
    goto LAB_001335d5;
  case F64X2:
    uStackY_180 = 2;
LAB_001335d5:
    local_14c = 0;
    break;
  default:
    local_c8 = (const_->loc).filename._M_len;
    pcStack_c0 = (const_->loc).filename._M_str;
    local_b8 = (const_->loc).field_1.field_1.offset;
    uStack_b0 = *(undefined8 *)((long)&(const_->loc).field_1 + 8);
    pcVar5 = GetTokenTypeName(token_type);
    Error(this,0x164162,pcVar5);
    return (Result)Error;
  }
  Consume((Token *)&value,this);
  GetLocation((Location *)&value,this);
  (const_->loc).field_1.field_1.offset = (size_t)local_128.field_1.offset;
  *(undefined8 *)((long)&(const_->loc).field_1 + 8) = local_128._8_8_;
  (const_->loc).filename._M_len = value;
  (const_->loc).filename._M_str = pcStack_130;
  local_144 = (int)uStackY_180 - 2U >> 1;
  uVar6 = 0;
  local_140 = (ulong)local_144;
  while( true ) {
    if (uStackY_180 == uVar6) {
      return (Result)Ok;
    }
    GetLocation(&loc,this);
    GetToken(&token,this);
    uVar3 = (ulong)token.token_type_;
    if (0x37 < uVar3) break;
    lane = (int)uVar6;
    if ((0x20000180000000U >> (uVar3 & 0x3f) & 1) != 0) {
      if ((char)local_14c == '\0') {
LAB_00133706:
        Const::Const((Const *)&value);
        if (uStackY_180 == 2) {
          RVar2 = ParseF64(this,(Const *)&value,local_148);
          Const::set_v128_f64(const_,lane,CONCAT44(local_118._20_4_,local_118._16_4_));
        }
        else {
          RVar2.enum_ = Ok;
          if ((int)uStackY_180 == 4) {
            RVar2 = ParseF32(this,(Const *)&value,local_148);
            Const::set_v128_f32(const_,lane,local_118._16_4_);
          }
        }
        if (uVar6 < 4) {
          const_->nan_[uVar6] = local_f8;
        }
        goto LAB_00133773;
      }
      goto LAB_001338cc;
    }
    if ((0xc0000000000000U >> (uVar3 & 0x3f) & 1) == 0) break;
    if ((char)local_14c == '\0') goto LAB_00133706;
    Consume((Token *)&value,this);
    pLVar4 = Token::literal((Token *)&value);
    if (local_144 < 8) {
      sVar1 = (pLVar4->text)._M_len;
      pcVar5 = (pLVar4->text)._M_str;
      switch((long)&switchD_001336db::switchdataD_00163904 +
             (long)(int)(&switchD_001336db::switchdataD_00163904)[local_140]) {
      case 0x1336dd:
        value = 0;
        RVar2 = ParseInt64(pcVar5,pcVar5 + sVar1,&value,SignedAndUnsigned);
        Const::set_v128_u64(const_,lane,value);
        break;
      case 0x13377d:
        goto switchD_001336db_caseD_13377d;
      case 0x133785:
        value = value & 0xffffffffffff0000;
        RVar2 = ParseInt16(pcVar5,pcVar5 + sVar1,(uint16_t *)&value,SignedAndUnsigned);
        Const::set_v128_u16(const_,lane,(uint16_t)value);
        break;
      case 0x1337ae:
        value = value & 0xffffffff00000000;
        RVar2 = ParseInt32(pcVar5,pcVar5 + sVar1,(uint32_t *)&value,SignedAndUnsigned);
        Const::set_v128_u32(const_,lane,(uint32_t)value);
        break;
      case 0x1337d5:
        value = value & 0xffffffffffffff00;
        RVar2 = ParseInt8(pcVar5,pcVar5 + sVar1,(uint8_t *)&value,SignedAndUnsigned);
        Const::set_v128_u8(const_,lane,(uint8_t)value);
      }
LAB_00133773:
      if (RVar2.enum_ == Error) {
        local_d8.offset = (size_t)loc.field_1.field_1.offset;
        uStack_d0 = loc.field_1._8_8_;
        local_e8 = loc.filename._M_len;
        pcStack_e0 = loc.filename._M_str;
        Token::to_string_abi_cxx11_((string *)&value,&token);
        Error(this,0x164202,(char *)value);
        std::__cxx11::string::_M_dispose();
        return (Result)Error;
      }
    }
switchD_001336db_caseD_13377d:
    uVar6 = uVar6 + 1;
  }
  if ((char)local_14c == '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&value,"a Float literal",&local_14d);
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,
               (string *)&value,local_118);
    pcVar5 = "42.0";
    goto LAB_00133910;
  }
LAB_001338cc:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&value,"a Nat or Integer literal",&local_14d);
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_range_initialize<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,
             (string *)&value,local_118);
  pcVar5 = "123";
LAB_00133910:
  RVar2 = ErrorExpected(this,&local_88,pcVar5);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  std::__cxx11::string::_M_dispose();
  return (Result)RVar2.enum_;
}

Assistant:

Result WastParser::ParseSimdV128Const(Const* const_,
                                      TokenType token_type,
                                      ConstType const_type) {
  WABT_TRACE(ParseSimdV128Const);

  uint8_t lane_count = 0;
  bool integer = true;
  switch (token_type) {
    case TokenType::I8X16: { lane_count = 16; break; }
    case TokenType::I16X8: { lane_count = 8; break; }
    case TokenType::I32X4: { lane_count = 4; break; }
    case TokenType::I64X2: { lane_count = 2; break; }
    case TokenType::F32X4: { lane_count = 4; integer = false; break; }
    case TokenType::F64X2: { lane_count = 2; integer = false; break; }
    default: {
      Error(const_->loc,
            "Unexpected type at start of simd constant. "
            "Expected one of: i8x16, i16x8, i32x4, i64x2, f32x4, f64x2. "
            "Found \"%s\".",
            GetTokenTypeName(token_type));
      return Result::Error;
    }
  }
  Consume();

  const_->loc = GetLocation();

  for (int lane = 0; lane < lane_count; ++lane) {
    Location loc = GetLocation();

    // Check that the lane literal type matches the element type of the v128:
    Token token = GetToken();
    switch (token.token_type()) {
      case TokenType::Nat:
      case TokenType::Int:
        // OK.
        break;

      case TokenType::Float:
      case TokenType::NanArithmetic:
      case TokenType::NanCanonical:
        if (integer) {
          goto error;
        }
        break;

      error:
      default:
        if (integer) {
          return ErrorExpected({"a Nat or Integer literal"}, "123");
        } else {
          return ErrorExpected({"a Float literal"}, "42.0");
        }
    }

    Result result;

    // For each type, parse the next literal, bound check it, and write it to
    // the array of bytes:
    if (integer) {
      std::string_view sv = Consume().literal().text;

      switch (lane_count) {
        case 16: {
          uint8_t value = 0;
          result = ParseInt8(sv, &value, ParseIntType::SignedAndUnsigned);
          const_->set_v128_u8(lane, value);
          break;
        }
        case 8: {
          uint16_t value = 0;
          result = ParseInt16(sv, &value, ParseIntType::SignedAndUnsigned);
          const_->set_v128_u16(lane, value);
          break;
        }
        case 4: {
          uint32_t value = 0;
          result = ParseInt32(sv, &value, ParseIntType::SignedAndUnsigned);
          const_->set_v128_u32(lane, value);
          break;
        }
        case 2: {
          uint64_t value = 0;
          result = ParseInt64(sv, &value, ParseIntType::SignedAndUnsigned);
          const_->set_v128_u64(lane, value);
          break;
        }
      }
    } else {
      Const lane_const_;
      switch (lane_count) {
        case 4:
          result = ParseF32(&lane_const_, const_type);
          const_->set_v128_f32(lane, lane_const_.f32_bits());
          break;

        case 2:
          result = ParseF64(&lane_const_, const_type);
          const_->set_v128_f64(lane, lane_const_.f64_bits());
          break;
      }

      const_->set_expected_nan(lane, lane_const_.expected_nan());
    }

    if (Failed(result)) {
      Error(loc, "invalid literal \"%s\"", token.to_string().c_str());
      return Result::Error;
    }
  }

  return Result::Ok;
}